

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopStart<(Js::LayoutSize)0,true>
          (InterpreterStackFrame *this,byte *ip)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  OpCode OVar4;
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *pOVar5;
  undefined4 *puVar6;
  code *pcVar7;
  LayoutSize local_34;
  byte *pbStack_30;
  LayoutSize localLayoutSize;
  byte *ip_local;
  
  pbStack_30 = ip;
  pOVar5 = ByteCodeReader::
           GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
                     ((ByteCodeReader *)this,&stack0xffffffffffffffd0);
  bVar1 = pOVar5->C1;
  lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  if (*(char *)(lVar2 + 0x1658) != -1) {
    *(char *)(lVar2 + 0x1658) = *(char *)(lVar2 + 0x1658) + '\x01';
  }
  bVar3 = DynamicProfileInfo::EnableImplicitCallFlags(*(FunctionBody **)(this + 0x88));
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x16b3,
                                "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                ,
                                "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                               );
    if (!bVar3) goto LAB_00961bab;
    *puVar6 = 0;
  }
  *(undefined1 *)(*(long *)(this + 0xc0) + (ulong)bVar1) = *(undefined1 *)(lVar2 + 0x1570);
  *(undefined1 *)(lVar2 + 0x1570) = 1;
  *(undefined4 *)(this + 0xd0) = 0;
  OVar4 = ByteCodeReader::PeekOp((ByteCodeReader *)this,pbStack_30,&local_34);
  if (OVar4 == ProfiledLoopBodyStart) {
    if (local_34 != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x16c3,"(localLayoutSize == layoutSize)",
                                  "localLayoutSize == layoutSize");
      if (!bVar3) goto LAB_00961bab;
      *puVar6 = 0;
    }
    pbStack_30 = pbStack_30 + 1;
    pOVar5 = ByteCodeReader::
             GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
                       ((ByteCodeReader *)this,&stack0xffffffffffffffd0);
    if (bVar1 != pOVar5->C1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x16c8,"(C1 == C2)","C1 == C2");
      if (!bVar3) goto LAB_00961bab;
      *puVar6 = 0;
    }
    pcVar7 = *(code **)(this + 0xf8);
    if (((ulong)pcVar7 & 1) != 0) {
      pcVar7 = *(code **)(pcVar7 + *(long *)(this + *(long *)(this + 0x100)) + -1);
    }
    (*pcVar7)(this + *(long *)(this + 0x100),(ulong)bVar1,0,1);
    pbStack_30 = ByteCodeReader::GetIP((ByteCodeReader *)this);
  }
  else if (OVar4 == LoopBodyStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x16c0,"(peekOp != OpCode::LoopBodyStart)",
                                "peekOp != OpCode::LoopBodyStart");
    if (!bVar3) {
LAB_00961bab:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar6 = 0;
  }
  return pbStack_30;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopStart(const byte * ip)
    {
        const uint32 C1 = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
        if (!profiled && !isAutoProfiling)
        {
            return ip;
        }

        ThreadContext *const threadContext = GetScriptContext()->GetThreadContext();
        threadContext->IncrementLoopDepth();

        // Save the implicit call flags. The interpreter may switch to profiling mode during LoopBodyStart, so always do this.
        Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
        this->savedLoopImplicitCallFlags[C1] = threadContext->GetImplicitCallFlags();
        threadContext->SetImplicitCallFlags(ImplicitCall_None);

        this->currentLoopCounter = 0;

        if (!profiled)
        {
            return ip;
        }

        LayoutSize localLayoutSize;
        OpCode peekOp = m_reader.PeekOp(ip, localLayoutSize);
        Assert(peekOp != OpCode::LoopBodyStart);
        if (peekOp == OpCode::ProfiledLoopBodyStart)
        {
            Assert(localLayoutSize == layoutSize);
            ip += Js::OpCodeUtil::EncodedSize(peekOp, layoutSize);
            // We are doing JIT loop body. Process the first ProfiledLoopBodyStart to avoid recording
            // the implicit call before the first iteration
            uint32 C2 = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
            Assert(C1 == C2);
            (this->*opProfiledLoopBodyStart)(C1, layoutSize, true /* isFirstIteration */);
            return m_reader.GetIP();
        }

        return ip;
    }